

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum_field_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::RepeatedImmutableEnumFieldLiteGenerator::GenerateFieldInfo
          (RepeatedImmutableEnumFieldLiteGenerator *this,Printer *printer,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *output)

{
  bool bVar1;
  long in_RDI;
  bool in_stack_0000017f;
  char *in_stack_00000180;
  char *in_stack_00000188;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000190;
  FieldDescriptor *in_stack_00000198;
  Printer *in_stack_000001a0;
  char *in_stack_000001b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001b8;
  Printer *in_stack_000001c0;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  int value;
  
  value = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  FieldDescriptor::number(*(FieldDescriptor **)(in_RDI + 8));
  WriteIntToUtf16CharSequence(value,in_stack_ffffffffffffffc8);
  GetExperimentalJavaFieldType((FieldDescriptor *)printer);
  WriteIntToUtf16CharSequence(value,in_stack_ffffffffffffffc8);
  io::Printer::Print(in_stack_000001c0,in_stack_000001b8,in_stack_000001b0);
  FieldDescriptor::file(*(FieldDescriptor **)(in_RDI + 8));
  bVar1 = SupportFieldPresence((FileDescriptor *)0x5b9b6c);
  if (bVar1) {
    Context::EnforceLite(*(Context **)(in_RDI + 0x40));
    PrintEnumVerifierLogic
              (in_stack_000001a0,in_stack_00000198,in_stack_00000190,in_stack_00000188,
               in_stack_00000180,in_stack_0000017f);
  }
  return;
}

Assistant:

void RepeatedImmutableEnumFieldLiteGenerator::GenerateFieldInfo(
    io::Printer* printer, std::vector<uint16>* output) const {
  WriteIntToUtf16CharSequence(descriptor_->number(), output);
  WriteIntToUtf16CharSequence(GetExperimentalJavaFieldType(descriptor_),
                              output);
  printer->Print(variables_, "\"$name$_\",\n");
  if (SupportFieldPresence(descriptor_->file())) {
    PrintEnumVerifierLogic(printer, descriptor_, variables_,
                           /*var_name=*/"$type$",
                           /*terminating_string=*/",\n",
                           /*enforce_lite=*/context_->EnforceLite());
  }
}